

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::SynchronizationTests::init(SynchronizationTests *this,EVP_PKEY_CTX *ctx)

{
  pointer pCVar1;
  int iVar2;
  int iVar3;
  Context *pCVar4;
  long *plVar5;
  WriteData WVar6;
  SynchronizationTests *pSVar7;
  long *plVar8;
  TestNode *pTVar9;
  undefined8 extraout_RAX;
  InterInvocationTestCase *pIVar10;
  long *plVar11;
  undefined8 uVar12;
  TestNode *node;
  InterCallTestCase *pIVar13;
  undefined8 *puVar14;
  long *plVar15;
  long lVar16;
  pointer pCVar17;
  uint flags;
  char *pcVar18;
  ostringstream s;
  allocator<char> local_2c9;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  long *local_288;
  undefined8 local_280;
  long local_278;
  undefined8 uStack_270;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  undefined1 local_248 [40];
  WriteData local_220;
  undefined1 *local_218 [2];
  undefined1 local_208 [4];
  undefined4 uStack_204;
  char *local_1f0;
  InterCallTestCase *local_1e8;
  SynchronizationTests *local_1e0;
  InterCallTestCase *local_1d8;
  TestNode *local_1d0;
  TestNode *local_1c8;
  long local_1c0;
  pointer local_1b8;
  TestNode *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  ios_base local_138 [264];
  
  local_220 = (WriteData)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_220,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "in_invocation","Test intra-invocation synchronization");
  local_1d8 = (InterCallTestCase *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1d8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "inter_invocation","Test inter-invocation synchronization");
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"inter_call",
             "Test inter-call synchronization");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)local_220);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)local_1d8);
  local_1b0 = pTVar9;
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  uVar12 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  local_1e0 = this;
  do {
    local_1e8 = local_1d8;
    if ((byte)uVar12 != 0) {
      local_1e8 = (InterCallTestCase *)local_220;
    }
    local_1b8 = (pointer)CONCAT44(local_1b8._4_4_,(int)uVar12);
    local_1d0 = (TestNode *)CONCAT44(local_1d0._4_4_,((byte)~(byte)uVar12 & 1) << 2);
    lVar16 = 0;
    do {
      iVar2 = *(int *)((long)&init::configs[0].storage + lVar16);
      local_1c8 = (TestNode *)0x19fbb94;
      local_1f0 = (char *)CONCAT44(local_1f0._4_4_,iVar2);
      if (iVar2 != 0) {
        local_1c8 = (TestNode *)0x1ba18f4;
      }
      pIVar10 = (InterInvocationTestCase *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      pcVar18 = *(char **)((long)&init::configs[0].namePrefix + lVar16);
      local_1c0 = lVar16;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,pcVar18,(allocator<char> *)local_248);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_1a8 = &local_198;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_198 = *plVar15;
        uStack_190 = (undefined4)plVar11[3];
        uStack_18c = *(undefined4 *)((long)plVar11 + 0x1c);
      }
      else {
        local_198 = *plVar15;
        local_1a8 = (long *)*plVar11;
      }
      plVar8 = local_1a8;
      local_1a0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      local_288 = &local_278;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Write to ","");
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8 = &local_2b8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_2b8 = *plVar15;
        lStack_2b0 = plVar11[3];
      }
      else {
        local_2b8 = *plVar15;
        local_2c8 = (long *)*plVar11;
      }
      local_2c0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_2a8 = &local_298;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_298 = *plVar15;
        lStack_290 = plVar11[3];
      }
      else {
        local_298 = *plVar15;
        local_2a8 = (long *)*plVar11;
      }
      local_2a0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      flags = *(uint *)((long)&init::configs[0].flags + local_1c0) | (uint)local_1d0;
      anon_unknown_1::InterInvocationTestCase::InterInvocationTestCase
                (pIVar10,pCVar4,(char *)plVar8,(char *)local_2a8,(StorageType)local_1f0,flags);
      (pIVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__InterInvocationTestCase_0215a6a8;
      tcu::TestNode::addChild((TestNode *)local_1e8,(TestNode *)pIVar10);
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      pSVar7 = local_1e0;
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258 + 1);
      }
      pIVar10 = (InterInvocationTestCase *)operator_new(0xa8);
      pCVar4 = (pSVar7->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,pcVar18,(allocator<char> *)local_248);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_1a8 = &local_198;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_198 = *plVar15;
        uStack_190 = (undefined4)plVar11[3];
        uStack_18c = *(undefined4 *)((long)plVar11 + 0x1c);
      }
      else {
        local_198 = *plVar15;
        local_1a8 = (long *)*plVar11;
      }
      plVar8 = local_1a8;
      local_1a0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      local_288 = &local_278;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Read form ","");
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8 = &local_2b8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_2b8 = *plVar15;
        lStack_2b0 = plVar11[3];
      }
      else {
        local_2b8 = *plVar15;
        local_2c8 = (long *)*plVar11;
      }
      local_2c0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_2a8 = &local_298;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_298 = *plVar15;
        lStack_290 = plVar11[3];
      }
      else {
        local_298 = *plVar15;
        local_2a8 = (long *)*plVar11;
      }
      local_2a0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      anon_unknown_1::InterInvocationTestCase::InterInvocationTestCase
                (pIVar10,pCVar4,(char *)plVar8,(char *)local_2a8,(StorageType)local_1f0,flags);
      (pIVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__InterInvocationTestCase_0215a778;
      tcu::TestNode::addChild((TestNode *)local_1e8,(TestNode *)pIVar10);
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      pSVar7 = local_1e0;
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258 + 1);
      }
      pIVar10 = (InterInvocationTestCase *)operator_new(0xa8);
      pCVar4 = (pSVar7->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,pcVar18,(allocator<char> *)local_248);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_1a8 = &local_198;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_198 = *plVar15;
        uStack_190 = (undefined4)plVar11[3];
        uStack_18c = *(undefined4 *)((long)plVar11 + 0x1c);
      }
      else {
        local_198 = *plVar15;
        local_1a8 = (long *)*plVar11;
      }
      plVar8 = local_1a8;
      local_1a0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      local_288 = &local_278;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Write to ","");
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8 = &local_2b8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_2b8 = *plVar15;
        lStack_2b0 = plVar11[3];
      }
      else {
        local_2b8 = *plVar15;
        local_2c8 = (long *)*plVar11;
      }
      local_2c0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_2a8 = &local_298;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_298 = *plVar15;
        lStack_290 = plVar11[3];
      }
      else {
        local_298 = *plVar15;
        local_2a8 = (long *)*plVar11;
      }
      local_2a0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      anon_unknown_1::InterInvocationTestCase::InterInvocationTestCase
                (pIVar10,pCVar4,(char *)plVar8,(char *)local_2a8,(StorageType)local_1f0,flags);
      (pIVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__InterInvocationTestCase_0215a7d8;
      tcu::TestNode::addChild((TestNode *)local_1e8,(TestNode *)pIVar10);
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      pSVar7 = local_1e0;
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258 + 1);
      }
      pIVar10 = (InterInvocationTestCase *)operator_new(0xb0);
      pCVar4 = (pSVar7->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,pcVar18,(allocator<char> *)local_248);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_1a8 = &local_198;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_198 = *plVar15;
        uStack_190 = (undefined4)plVar11[3];
        uStack_18c = *(undefined4 *)((long)plVar11 + 0x1c);
      }
      else {
        local_198 = *plVar15;
        local_1a8 = (long *)*plVar11;
      }
      plVar8 = local_1a8;
      local_1a0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      local_288 = &local_278;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Write to aliasing ","");
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8 = &local_2b8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_2b8 = *plVar15;
        lStack_2b0 = plVar11[3];
      }
      else {
        local_2b8 = *plVar15;
        local_2c8 = (long *)*plVar11;
      }
      local_2c0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_2a8 = &local_298;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_298 = *plVar15;
        lStack_290 = plVar11[3];
      }
      else {
        local_298 = *plVar15;
        local_2a8 = (long *)*plVar11;
      }
      local_2a0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      anon_unknown_1::InterInvocationTestCase::InterInvocationTestCase
                (pIVar10,pCVar4,(char *)plVar8,(char *)local_2a8,(StorageType)local_1f0,flags | 2);
      (pIVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__InterInvocationTestCase_0215a838;
      *(undefined4 *)&pIVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
      tcu::TestNode::addChild((TestNode *)local_1e8,(TestNode *)pIVar10);
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      this = local_1e0;
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258 + 1);
      }
      pIVar10 = (InterInvocationTestCase *)operator_new(0xb0);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,pcVar18,(allocator<char> *)local_248);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_1a8 = &local_198;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_198 = *plVar15;
        uStack_190 = (undefined4)plVar11[3];
        uStack_18c = *(undefined4 *)((long)plVar11 + 0x1c);
      }
      else {
        local_198 = *plVar15;
        local_1a8 = (long *)*plVar11;
      }
      plVar8 = local_1a8;
      local_1a0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      local_288 = &local_278;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Write to aliasing ","");
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8 = &local_2b8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_2b8 = *plVar15;
        lStack_2b0 = plVar11[3];
      }
      else {
        local_2b8 = *plVar15;
        local_2c8 = (long *)*plVar11;
      }
      local_2c0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_2a8 = &local_298;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_298 = *plVar15;
        lStack_290 = plVar11[3];
      }
      else {
        local_298 = *plVar15;
        local_2a8 = (long *)*plVar11;
      }
      local_2a0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      anon_unknown_1::InterInvocationTestCase::InterInvocationTestCase
                (pIVar10,pCVar4,(char *)plVar8,(char *)local_2a8,(StorageType)local_1f0,flags | 2);
      (pIVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__InterInvocationTestCase_0215a838;
      *(undefined4 *)&pIVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
      tcu::TestNode::addChild((TestNode *)local_1e8,(TestNode *)pIVar10);
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      lVar16 = local_1c0;
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258 + 1);
      }
      lVar16 = lVar16 + 0x10;
    } while (lVar16 != 0x40);
    uVar12 = 0;
  } while (((ulong)local_1b8 & 1) != 0);
  local_1d0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1d0,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "with_memory_barrier","Synchronize with memory barrier");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "without_memory_barrier","Synchronize without memory barrier");
  pTVar9 = local_1b0;
  tcu::TestNode::addChild(local_1b0,local_1d0);
  tcu::TestNode::addChild(pTVar9,node);
  pTVar9 = (TestNode *)0x0;
  local_1c8 = node;
  do {
    iVar2 = *(int *)&pTVar9[0x4c3c3].m_children.
                     super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
    local_1f0 = "buffer";
    local_1e8 = (InterCallTestCase *)CONCAT44(local_1e8._4_4_,iVar2);
    if (iVar2 != 0) {
      local_1f0 = "image";
    }
    local_220 = (WriteData)operator_new(0x108);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_1b8 = pTVar9[0x4c3c3].m_children.
                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,(char *)local_1b8,&local_2c9);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_1a8 = &local_198;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_198 = *plVar15;
      uStack_190 = (undefined4)plVar11[3];
      uStack_18c = *(undefined4 *)((long)plVar11 + 0x1c);
    }
    else {
      local_198 = *plVar15;
      local_1a8 = (long *)*plVar11;
    }
    plVar8 = local_1a8;
    local_1a0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_288 = &local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Write to ","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2c8 = &local_2b8;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_2b8 = *plVar15;
      lStack_2b0 = plVar11[3];
    }
    else {
      local_2b8 = *plVar15;
      local_2c8 = (long *)*plVar11;
    }
    local_2c0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_2a8 = &local_298;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_298 = *plVar15;
      lStack_290 = plVar11[3];
    }
    else {
      local_298 = *plVar15;
      local_2a8 = (long *)*plVar11;
    }
    plVar5 = local_2a8;
    local_2a0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_1c0 = CONCAT44(local_1c0._4_4_,
                         *(undefined4 *)
                          ((long)&pTVar9[0x4c3c3].m_children.
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_248._16_8_ = (pointer)0x0;
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = (pointer)0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    local_1b0 = pTVar9;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_WRITE;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 1;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x7b;
    local_208 = (undefined1  [4])0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    WVar6 = local_220;
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_BARRIER;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_READ;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 1;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x7b;
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              ((InterCallTestCase *)WVar6,pCVar4,(char *)plVar8,(char *)plVar5,
               (StorageType)local_1e8,(int)local_1c0,(InterCallOperations *)local_248);
    tcu::TestNode::addChild(local_1d0,(TestNode *)WVar6);
    if ((pointer)local_248._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
    }
    pSVar7 = local_1e0;
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pIVar13 = (InterCallTestCase *)operator_new(0x108);
    pCVar4 = (pSVar7->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,(char *)local_1b8,&local_2c9);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_1a8 = &local_198;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_198 = *plVar15;
      uStack_190 = (undefined4)plVar11[3];
      uStack_18c = *(undefined4 *)((long)plVar11 + 0x1c);
    }
    else {
      local_198 = *plVar15;
      local_1a8 = (long *)*plVar11;
    }
    plVar8 = local_1a8;
    local_1a0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_288 = &local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Read from ","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2c8 = &local_2b8;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_2b8 = *plVar15;
      lStack_2b0 = plVar11[3];
    }
    else {
      local_2b8 = *plVar15;
      local_2c8 = (long *)*plVar11;
    }
    local_2c0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_2a8 = &local_298;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_298 = *plVar15;
      lStack_290 = plVar11[3];
    }
    else {
      local_298 = *plVar15;
      local_2a8 = (long *)*plVar11;
    }
    plVar5 = local_2a8;
    local_2a0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_248._16_8_ = (pointer)0x0;
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = (pointer)0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    *(undefined8 *)(local_248._8_8_ + -0x14) = 0x100000006;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_BARRIER;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_WRITE;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 1;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x7b;
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar13,pCVar4,(char *)plVar8,(char *)plVar5,(StorageType)local_1e8,(int)local_1c0,
               (InterCallOperations *)local_248);
    tcu::TestNode::addChild(local_1d0,(TestNode *)pIVar13);
    if ((pointer)local_248._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pIVar13 = (InterCallTestCase *)operator_new(0x108);
    pCVar4 = (local_1e0->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,(char *)local_1b8,&local_2c9);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_1a8 = &local_198;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_198 = *plVar15;
      uStack_190 = (undefined4)plVar11[3];
      uStack_18c = *(undefined4 *)((long)plVar11 + 0x1c);
    }
    else {
      local_198 = *plVar15;
      local_1a8 = (long *)*plVar11;
    }
    plVar8 = local_1a8;
    local_1a0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_288 = &local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Write to ","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2c8 = &local_2b8;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_2b8 = *plVar15;
      lStack_2b0 = plVar11[3];
    }
    else {
      local_2b8 = *plVar15;
      local_2c8 = (long *)*plVar11;
    }
    local_2c0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_2a8 = &local_298;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_298 = *plVar15;
      lStack_290 = plVar11[3];
    }
    else {
      local_298 = *plVar15;
      local_2a8 = (long *)*plVar11;
    }
    plVar5 = local_2a8;
    local_2a0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_248._16_8_ = (pointer)0x0;
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = (pointer)0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    local_1d8 = pIVar13;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_WRITE;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 1;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x7b;
    local_208 = (undefined1  [4])0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_BARRIER;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_WRITE;
    local_220.targetHandle = 1;
    local_220.seed = 0x1c9;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 1;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x1c9;
    local_208 = (undefined1  [4])0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    pIVar13 = local_1d8;
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_BARRIER;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_READ;
    (((pointer)(local_248._8_8_ + -0x14))->u_cmd).write = local_220;
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar13,pCVar4,(char *)plVar8,(char *)plVar5,(StorageType)local_1e8,(int)local_1c0,
               (InterCallOperations *)local_248);
    tcu::TestNode::addChild(local_1d0,(TestNode *)pIVar13);
    if ((pointer)local_248._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
    }
    pSVar7 = local_1e0;
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pIVar13 = (InterCallTestCase *)operator_new(0x108);
    pCVar4 = (pSVar7->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,(char *)local_1b8,&local_2c9);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_1a8 = &local_198;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_198 = *plVar15;
      uStack_190 = (undefined4)plVar11[3];
      uStack_18c = *(undefined4 *)((long)plVar11 + 0x1c);
    }
    else {
      local_198 = *plVar15;
      local_1a8 = (long *)*plVar11;
    }
    plVar8 = local_1a8;
    local_1a0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_288 = &local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Write to multiple ","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2c8 = &local_2b8;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_2b8 = *plVar15;
      lStack_2b0 = plVar11[3];
    }
    else {
      local_2b8 = *plVar15;
      local_2c8 = (long *)*plVar11;
    }
    local_2c0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_2a8 = &local_298;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_298 = *plVar15;
      lStack_290 = plVar11[3];
    }
    else {
      local_298 = *plVar15;
      local_2a8 = (long *)*plVar11;
    }
    plVar5 = local_2a8;
    local_2a0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_248._16_8_ = (pointer)0x0;
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = (pointer)0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    local_1d8 = pIVar13;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_WRITE;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 1;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x7b;
    local_208 = (undefined1  [4])0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_WRITE;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 2;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x1c9;
    local_208 = (undefined1  [4])0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    pIVar13 = local_1d8;
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_BARRIER;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_READ_MULTIPLE;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 1;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x7b;
    *(undefined8 *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 8) = 0x1c900000002;
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar13,pCVar4,(char *)plVar8,(char *)plVar5,(StorageType)local_1e8,(int)local_1c0,
               (InterCallOperations *)local_248);
    tcu::TestNode::addChild(local_1d0,(TestNode *)pIVar13);
    if ((pointer)local_248._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
    }
    pSVar7 = local_1e0;
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pIVar13 = (InterCallTestCase *)operator_new(0x108);
    pCVar4 = (pSVar7->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,(char *)local_1b8,&local_2c9);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_1a8 = &local_198;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_198 = *plVar15;
      uStack_190 = (undefined4)plVar11[3];
      uStack_18c = *(undefined4 *)((long)plVar11 + 0x1c);
    }
    else {
      local_198 = *plVar15;
      local_1a8 = (long *)*plVar11;
    }
    plVar8 = local_1a8;
    local_1a0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_288 = &local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Write to same ","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2c8 = &local_2b8;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_2b8 = *plVar15;
      lStack_2b0 = plVar11[3];
    }
    else {
      local_2b8 = *plVar15;
      local_2c8 = (long *)*plVar11;
    }
    local_2c0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_2a8 = &local_298;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_298 = *plVar15;
      lStack_290 = plVar11[3];
    }
    else {
      local_298 = *plVar15;
      local_2a8 = (long *)*plVar11;
    }
    plVar5 = local_2a8;
    local_2a0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_248._16_8_ = (pointer)0x0;
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = (pointer)0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_WRITE_INTERLEAVE;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 1;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x7b;
    (((pointer)(local_248._8_8_ + -0x14))->u_cmd).writeInterleave.evenOdd = true;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_WRITE_INTERLEAVE;
    (((pointer)(local_248._8_8_ + -0x14))->u_cmd).write = local_220;
    (((pointer)(local_248._8_8_ + -0x14))->u_cmd).writeInterleave.evenOdd = false;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_BARRIER;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_READ_INTERLEAVE;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 1;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x7b;
    (((pointer)(local_248._8_8_ + -0x14))->u_cmd).readMulti.targetHandle1 = 0x1c9;
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar13,pCVar4,(char *)plVar8,(char *)plVar5,(StorageType)local_1e8,(int)local_1c0,
               (InterCallOperations *)local_248);
    tcu::TestNode::addChild(local_1d0,(TestNode *)pIVar13);
    if ((pointer)local_248._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pIVar13 = (InterCallTestCase *)operator_new(0x108);
    pCVar4 = (local_1e0->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,(char *)local_1b8,&local_2c9);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_1a8 = &local_198;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_198 = *plVar15;
      uStack_190 = (undefined4)plVar11[3];
      uStack_18c = *(undefined4 *)((long)plVar11 + 0x1c);
    }
    else {
      local_198 = *plVar15;
      local_1a8 = (long *)*plVar11;
    }
    plVar8 = local_1a8;
    local_1a0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_288 = &local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Two unrelated ","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2c8 = &local_2b8;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_2b8 = *plVar15;
      lStack_2b0 = plVar11[3];
    }
    else {
      local_2b8 = *plVar15;
      local_2c8 = (long *)*plVar11;
    }
    local_2c0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_2a8 = &local_298;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_298 = *plVar15;
      lStack_290 = plVar11[3];
    }
    else {
      local_298 = *plVar15;
      local_2a8 = (long *)*plVar11;
    }
    plVar5 = local_2a8;
    local_2a0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_248._16_8_ = (pointer)0x0;
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = (pointer)0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    local_220 = (WriteData)pIVar13;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_WRITE;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 1;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x7b;
    local_208 = (undefined1  [4])0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_WRITE;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 2;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x1c9;
    local_208 = (undefined1  [4])0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_BARRIER;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    WVar6 = local_220;
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_READ;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 1;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x7b;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_READ;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 2;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x1c9;
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              ((InterCallTestCase *)WVar6,pCVar4,(char *)plVar8,(char *)plVar5,
               (StorageType)local_1e8,(int)local_1c0,(InterCallOperations *)local_248);
    tcu::TestNode::addChild(local_1d0,(TestNode *)WVar6);
    if ((pointer)local_248._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pIVar13 = (InterCallTestCase *)operator_new(0x108);
    pCVar4 = (local_1e0->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,(char *)local_1b8,&local_2c9);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_1a8 = &local_198;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_198 = *plVar15;
      uStack_190 = (undefined4)plVar11[3];
      uStack_18c = *(undefined4 *)((long)plVar11 + 0x1c);
    }
    else {
      local_198 = *plVar15;
      local_1a8 = (long *)*plVar11;
    }
    plVar8 = local_1a8;
    local_1a0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_288 = &local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Two unrelated ","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2c8 = &local_2b8;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_2b8 = *plVar15;
      lStack_2b0 = plVar11[3];
    }
    else {
      local_2b8 = *plVar15;
      local_2c8 = (long *)*plVar11;
    }
    local_2c0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_2a8 = &local_298;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_298 = *plVar15;
      lStack_290 = plVar11[3];
    }
    else {
      local_298 = *plVar15;
      local_2a8 = (long *)*plVar11;
    }
    plVar5 = local_2a8;
    local_2a0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_248._16_8_ = (pointer)0x0;
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = (pointer)0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    local_220 = (WriteData)pIVar13;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_WRITE;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 1;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x7b;
    local_208 = (undefined1  [4])0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_WRITE;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 2;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x1c9;
    local_208 = (undefined1  [4])0x0;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_BARRIER;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    WVar6 = local_220;
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_READ;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 2;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x1c9;
    local_218[0] = (undefined1 *)0x0;
    local_218[1] = (undefined1 *)0x0;
    local_208 = (undefined1  [4])0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)local_248,(value_type *)local_218);
    ((pointer)(local_248._8_8_ + -0x14))->type = TYPE_READ;
    *(int *)&((pointer)(local_248._8_8_ + -0x14))->u_cmd = 1;
    *(int *)((long)&((pointer)(local_248._8_8_ + -0x14))->u_cmd + 4) = 0x7b;
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              ((InterCallTestCase *)WVar6,pCVar4,(char *)plVar8,(char *)plVar5,
               (StorageType)local_1e8,(int)local_1c0,(InterCallOperations *)local_248);
    tcu::TestNode::addChild(local_1d0,(TestNode *)WVar6);
    if ((pointer)local_248._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
    }
    this = local_1e0;
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pTVar9 = (TestNode *)&local_1b0->m_name;
  } while (pTVar9 != (TestNode *)0x40);
  lVar16 = 0;
  do {
    pcVar18 = (char *)0x0;
    local_1e8 = (InterCallTestCase *)lVar16;
    do {
      pTVar9 = (TestNode *)operator_new(0xa8);
      pCVar4 = (local_1e0->super_TestCaseGroup).m_context;
      local_248._0_8_ = local_248 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_248,"ssbo_atomic_dispatch_","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      iVar2 = *(int *)((long)init::callCounts + (long)pcVar18);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      pCVar17 = (pointer)0xf;
      if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
        pCVar17 = (pointer)local_248._16_8_;
      }
      pCVar1 = (pointer)((long)(CommandType *)local_248._8_8_ + (long)local_218[1]);
      if (pCVar17 < pCVar1) {
        pCVar17 = (pointer)0xf;
        if (local_218[0] != (undefined1 *)((long)&((value_type *)local_218)->u_cmd + 0xcU)) {
          pCVar17 = (pointer)CONCAT44(uStack_204,local_208);
        }
        if (pCVar17 < pCVar1) goto LAB_014b91c0;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,local_248._0_8_);
      }
      else {
LAB_014b91c0:
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append(local_248,(ulong)local_218[0]);
      }
      local_288 = &local_278;
      plVar11 = puVar14 + 2;
      if ((long *)*puVar14 == plVar11) {
        local_278 = *plVar11;
        uStack_270 = puVar14[3];
      }
      else {
        local_278 = *plVar11;
        local_288 = (long *)*puVar14;
      }
      local_280 = puVar14[1];
      *puVar14 = plVar11;
      puVar14[1] = 0;
      *(undefined1 *)plVar11 = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8 = &local_2b8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_2b8 = *plVar15;
        lStack_2b0 = plVar11[3];
      }
      else {
        local_2b8 = *plVar15;
        local_2c8 = (long *)*plVar11;
      }
      local_2c0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_2a8 = &local_298;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_298 = *plVar15;
        lStack_290 = plVar11[3];
      }
      else {
        local_298 = *plVar15;
        local_2a8 = (long *)*plVar11;
      }
      local_2a0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_268 = &local_258;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_258 = *plVar15;
        lStack_250 = plVar11[3];
      }
      else {
        local_258 = *plVar15;
        local_268 = (long *)*plVar11;
      }
      local_260 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      iVar3 = init::ssboInvocations[lVar16].count;
      local_1f0 = pcVar18;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_268,
                 glcts::fixed_sample_locations_values + 1);
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__SSBOConcurrentAtomicCase_0215a8e0;
      *(int *)&pTVar9[1].m_testCtx = iVar2;
      *(int *)((long)&pTVar9[1].m_testCtx + 4) = iVar3;
      pTVar9[1].m_name._M_dataplus._M_p = (pointer)0x0;
      *(undefined4 *)&pTVar9[1].m_name._M_string_length = 0;
      pTVar9[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar9[1].m_name.field_2 + 8) = 0;
      pTVar9[1].m_description._M_dataplus._M_p = (pointer)0x0;
      tcu::TestNode::addChild(local_1c8,pTVar9);
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258 + 1);
      }
      pcVar18 = local_1f0;
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if (local_218[0] != (undefined1 *)((long)&((value_type *)local_218)->u_cmd + 0xcU)) {
        operator_delete(local_218[0],CONCAT44(uStack_204,local_208) + 1);
      }
      if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
        operator_delete((void *)local_248._0_8_,(ulong)((long)(CommandType *)local_248._16_8_ + 1));
      }
      pcVar18 = pcVar18 + 4;
    } while (pcVar18 != (char *)0xc);
    lVar16 = (long)local_1e8 + 1;
  } while (lVar16 != 3);
  lVar16 = 0;
  do {
    pcVar18 = (char *)0x0;
    local_1e8 = (InterCallTestCase *)lVar16;
    do {
      pTVar9 = (TestNode *)operator_new(0xb8);
      pCVar4 = (local_1e0->super_TestCaseGroup).m_context;
      local_248._0_8_ = local_248 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_248,"image_atomic_dispatch_","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      iVar2 = *(int *)((long)init::callCounts + (long)pcVar18);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      pCVar17 = (pointer)0xf;
      if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
        pCVar17 = (pointer)local_248._16_8_;
      }
      pCVar1 = (pointer)((long)(CommandType *)local_248._8_8_ + (long)local_218[1]);
      if (pCVar17 < pCVar1) {
        pCVar17 = (pointer)0xf;
        if (local_218[0] != (undefined1 *)((long)&((value_type *)local_218)->u_cmd + 0xcU)) {
          pCVar17 = (pointer)CONCAT44(uStack_204,local_208);
        }
        if (pCVar17 < pCVar1) goto LAB_014b95bb;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,local_248._0_8_);
      }
      else {
LAB_014b95bb:
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append(local_248,(ulong)local_218[0]);
      }
      local_288 = &local_278;
      plVar11 = puVar14 + 2;
      if ((long *)*puVar14 == plVar11) {
        local_278 = *plVar11;
        uStack_270 = puVar14[3];
      }
      else {
        local_278 = *plVar11;
        local_288 = (long *)*puVar14;
      }
      local_280 = puVar14[1];
      *puVar14 = plVar11;
      puVar14[1] = 0;
      *(undefined1 *)plVar11 = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8 = &local_2b8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_2b8 = *plVar15;
        lStack_2b0 = plVar11[3];
      }
      else {
        local_2b8 = *plVar15;
        local_2c8 = (long *)*plVar11;
      }
      local_2c0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_2a8 = &local_298;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_298 = *plVar15;
        lStack_290 = plVar11[3];
      }
      else {
        local_298 = *plVar15;
        local_2a8 = (long *)*plVar11;
      }
      local_2a0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_268 = &local_258;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_258 = *plVar15;
        lStack_250 = plVar11[3];
      }
      else {
        local_258 = *plVar15;
        local_268 = (long *)*plVar11;
      }
      local_260 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      iVar3 = init::imageInvocations[lVar16].count;
      local_1f0 = pcVar18;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_268,
                 glcts::fixed_sample_locations_values + 1);
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__ConcurrentImageAtomicCase_0215a930;
      *(int *)&pTVar9[1].m_testCtx = iVar2;
      *(int *)((long)&pTVar9[1].m_testCtx + 4) = iVar3;
      pTVar9[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar9[1].m_description._M_string_length = 0;
      pTVar9[1].m_description.field_2._M_allocated_capacity = 0;
      pTVar9[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar9[1].m_name._M_string_length = 0;
      *(undefined8 *)((long)&pTVar9[1].m_name._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar9[1].m_name.field_2 + 4) = 0;
      tcu::TestNode::addChild(local_1c8,pTVar9);
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258 + 1);
      }
      pcVar18 = local_1f0;
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if (local_218[0] != (undefined1 *)((long)&((value_type *)local_218)->u_cmd + 0xcU)) {
        operator_delete(local_218[0],CONCAT44(uStack_204,local_208) + 1);
      }
      if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
        operator_delete((void *)local_248._0_8_,(ulong)((long)(CommandType *)local_248._16_8_ + 1));
      }
      pcVar18 = pcVar18 + 4;
    } while (pcVar18 != (char *)0xc);
    lVar16 = (long)local_1e8 + 1;
  } while (lVar16 != 3);
  lVar16 = 0;
  do {
    pcVar18 = (char *)0x0;
    local_1e8 = (InterCallTestCase *)lVar16;
    do {
      pTVar9 = (TestNode *)operator_new(0x98);
      pCVar4 = (local_1e0->super_TestCaseGroup).m_context;
      local_248._0_8_ = local_248 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_248,"atomic_counter_dispatch_","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      iVar2 = *(int *)((long)init::callCounts + (long)pcVar18);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      pCVar17 = (pointer)0xf;
      if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
        pCVar17 = (pointer)local_248._16_8_;
      }
      pCVar1 = (pointer)((long)(CommandType *)local_248._8_8_ + (long)local_218[1]);
      if (pCVar17 < pCVar1) {
        pCVar17 = (pointer)0xf;
        if (local_218[0] != (undefined1 *)((long)&((value_type *)local_218)->u_cmd + 0xcU)) {
          pCVar17 = (pointer)CONCAT44(uStack_204,local_208);
        }
        if (pCVar17 < pCVar1) goto LAB_014b99b7;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,local_248._0_8_);
      }
      else {
LAB_014b99b7:
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append(local_248,(ulong)local_218[0]);
      }
      local_288 = &local_278;
      plVar11 = puVar14 + 2;
      if ((long *)*puVar14 == plVar11) {
        local_278 = *plVar11;
        uStack_270 = puVar14[3];
      }
      else {
        local_278 = *plVar11;
        local_288 = (long *)*puVar14;
      }
      local_280 = puVar14[1];
      *puVar14 = plVar11;
      puVar14[1] = 0;
      *(undefined1 *)plVar11 = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8 = &local_2b8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_2b8 = *plVar15;
        lStack_2b0 = plVar11[3];
      }
      else {
        local_2b8 = *plVar15;
        local_2c8 = (long *)*plVar11;
      }
      local_2c0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_2a8 = &local_298;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_298 = *plVar15;
        lStack_290 = plVar11[3];
      }
      else {
        local_298 = *plVar15;
        local_2a8 = (long *)*plVar11;
      }
      local_2a0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_268 = &local_258;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_258 = *plVar15;
        lStack_250 = plVar11[3];
      }
      else {
        local_258 = *plVar15;
        local_268 = (long *)*plVar11;
      }
      local_260 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      iVar3 = init::counterInvocations[lVar16].count;
      local_1f0 = pcVar18;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_268,
                 glcts::fixed_sample_locations_values + 1);
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__ConcurrentAtomicCounterCase_0215a980;
      *(int *)&pTVar9[1].m_testCtx = iVar2;
      *(int *)((long)&pTVar9[1].m_testCtx + 4) = iVar3;
      pTVar9[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar9[1].m_name._M_string_length = 0;
      pTVar9[1].m_name.field_2._M_allocated_capacity = 0;
      tcu::TestNode::addChild(local_1c8,pTVar9);
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258 + 1);
      }
      pcVar18 = local_1f0;
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if (local_218[0] != (undefined1 *)((long)&((value_type *)local_218)->u_cmd + 0xcU)) {
        operator_delete(local_218[0],CONCAT44(uStack_204,local_208) + 1);
      }
      if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
        operator_delete((void *)local_248._0_8_,(ulong)((long)(CommandType *)local_248._16_8_ + 1));
      }
      pcVar18 = pcVar18 + 4;
    } while (pcVar18 != (char *)0xc);
    lVar16 = (long)local_1e8 + 1;
  } while (lVar16 != 3);
  lVar16 = 0;
  do {
    pcVar18 = (char *)0x0;
    local_1e8 = (InterCallTestCase *)lVar16;
    do {
      pTVar9 = (TestNode *)operator_new(0x98);
      pCVar4 = (local_1e0->super_TestCaseGroup).m_context;
      local_248._0_8_ = local_248 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_248,"ssbo_atomic_counter_mixed_dispatch_","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      iVar2 = *(int *)((long)init::callCounts + (long)pcVar18);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      pCVar17 = (pointer)0xf;
      if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
        pCVar17 = (pointer)local_248._16_8_;
      }
      pCVar1 = (pointer)((long)(CommandType *)local_248._8_8_ + (long)local_218[1]);
      if (pCVar17 < pCVar1) {
        pCVar17 = (pointer)0xf;
        if (local_218[0] != (undefined1 *)((long)&((value_type *)local_218)->u_cmd + 0xcU)) {
          pCVar17 = (pointer)CONCAT44(uStack_204,local_208);
        }
        if (pCVar17 < pCVar1) goto LAB_014b9da3;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,local_248._0_8_);
      }
      else {
LAB_014b9da3:
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append(local_248,(ulong)local_218[0]);
      }
      local_288 = &local_278;
      plVar11 = puVar14 + 2;
      if ((long *)*puVar14 == plVar11) {
        local_278 = *plVar11;
        uStack_270 = puVar14[3];
      }
      else {
        local_278 = *plVar11;
        local_288 = (long *)*puVar14;
      }
      local_280 = puVar14[1];
      *puVar14 = plVar11;
      puVar14[1] = 0;
      *(undefined1 *)plVar11 = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8 = &local_2b8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_2b8 = *plVar15;
        lStack_2b0 = plVar11[3];
      }
      else {
        local_2b8 = *plVar15;
        local_2c8 = (long *)*plVar11;
      }
      local_2c0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_2a8 = &local_298;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_298 = *plVar15;
        lStack_290 = plVar11[3];
      }
      else {
        local_298 = *plVar15;
        local_2a8 = (long *)*plVar11;
      }
      local_2a0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_268 = &local_258;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_258 = *plVar15;
        lStack_250 = plVar11[3];
      }
      else {
        local_258 = *plVar15;
        local_268 = (long *)*plVar11;
      }
      local_260 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      iVar3 = init::counterInvocations[lVar16].count;
      local_1f0 = pcVar18;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_268,
                 glcts::fixed_sample_locations_values + 1);
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__ConcurrentSSBOAtomicCounterMixedCase_0215a9d0;
      *(int *)&pTVar9[1].m_testCtx = iVar2;
      *(int *)((long)&pTVar9[1].m_testCtx + 4) = iVar3;
      *(undefined4 *)&pTVar9[1].m_name._M_dataplus._M_p = 0;
      pTVar9[1].m_name._M_string_length = 0;
      pTVar9[1].m_name.field_2._M_allocated_capacity = 0;
      tcu::TestNode::addChild(local_1c8,pTVar9);
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258 + 1);
      }
      pcVar18 = local_1f0;
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if (local_218[0] != (undefined1 *)((long)&((value_type *)local_218)->u_cmd + 0xcU)) {
        operator_delete(local_218[0],CONCAT44(uStack_204,local_208) + 1);
      }
      if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
        operator_delete((void *)local_248._0_8_,(ulong)((long)(CommandType *)local_248._16_8_ + 1));
      }
      pcVar18 = pcVar18 + 4;
    } while (pcVar18 != (char *)0xc);
    lVar16 = (long)local_1e8 + 1;
    if (lVar16 == 3) {
      return 3;
    }
  } while( true );
}

Assistant:

void SynchronizationTests::init (void)
{
	tcu::TestCaseGroup* const inInvocationGroup		= new tcu::TestCaseGroup(m_testCtx, "in_invocation",	"Test intra-invocation synchronization");
	tcu::TestCaseGroup* const interInvocationGroup	= new tcu::TestCaseGroup(m_testCtx, "inter_invocation", "Test inter-invocation synchronization");
	tcu::TestCaseGroup* const interCallGroup		= new tcu::TestCaseGroup(m_testCtx, "inter_call",       "Test inter-call synchronization");

	addChild(inInvocationGroup);
	addChild(interInvocationGroup);
	addChild(interCallGroup);

	// .in_invocation & .inter_invocation
	{
		static const struct CaseConfig
		{
			const char*									namePrefix;
			const InterInvocationTestCase::StorageType	storage;
			const int									flags;
		} configs[] =
		{
			{ "image",			InterInvocationTestCase::STORAGE_IMAGE,		0										},
			{ "image_atomic",	InterInvocationTestCase::STORAGE_IMAGE,		InterInvocationTestCase::FLAG_ATOMIC	},
			{ "ssbo",			InterInvocationTestCase::STORAGE_BUFFER,	0										},
			{ "ssbo_atomic",	InterInvocationTestCase::STORAGE_BUFFER,	InterInvocationTestCase::FLAG_ATOMIC	},
		};

		for (int groupNdx = 0; groupNdx < 2; ++groupNdx)
		{
			tcu::TestCaseGroup* const	targetGroup	= (groupNdx == 0) ? (inInvocationGroup) : (interInvocationGroup);
			const int					extraFlags	= (groupNdx == 0) ? (0) : (InterInvocationTestCase::FLAG_IN_GROUP);

			for (int configNdx = 0; configNdx < DE_LENGTH_OF_ARRAY(configs); ++configNdx)
			{
				const char* const target = (configs[configNdx].storage == InterInvocationTestCase::STORAGE_BUFFER) ? ("buffer") : ("image");

				targetGroup->addChild(new InvocationWriteReadCase(m_context,
																  (std::string(configs[configNdx].namePrefix) + "_write_read").c_str(),
																  (std::string("Write to ") + target + " and read it").c_str(),
																  configs[configNdx].storage,
																  configs[configNdx].flags | extraFlags));

				targetGroup->addChild(new InvocationReadWriteCase(m_context,
																  (std::string(configs[configNdx].namePrefix) + "_read_write").c_str(),
																  (std::string("Read form ") + target + " and then write to it").c_str(),
																  configs[configNdx].storage,
																  configs[configNdx].flags | extraFlags));

				targetGroup->addChild(new InvocationOverWriteCase(m_context,
																  (std::string(configs[configNdx].namePrefix) + "_overwrite").c_str(),
																  (std::string("Write to ") + target + " twice and read it").c_str(),
																  configs[configNdx].storage,
																  configs[configNdx].flags | extraFlags));

				targetGroup->addChild(new InvocationAliasWriteCase(m_context,
																   (std::string(configs[configNdx].namePrefix) + "_alias_write").c_str(),
																   (std::string("Write to aliasing ") + target + " and read it").c_str(),
																   InvocationAliasWriteCase::TYPE_WRITE,
																   configs[configNdx].storage,
																   configs[configNdx].flags | extraFlags));

				targetGroup->addChild(new InvocationAliasWriteCase(m_context,
																   (std::string(configs[configNdx].namePrefix) + "_alias_overwrite").c_str(),
																   (std::string("Write to aliasing ") + target + "s and read it").c_str(),
																   InvocationAliasWriteCase::TYPE_OVERWRITE,
																   configs[configNdx].storage,
																   configs[configNdx].flags | extraFlags));
			}
		}
	}

	// .inter_call
	{
		tcu::TestCaseGroup* const withBarrierGroup		= new tcu::TestCaseGroup(m_testCtx, "with_memory_barrier", "Synchronize with memory barrier");
		tcu::TestCaseGroup* const withoutBarrierGroup	= new tcu::TestCaseGroup(m_testCtx, "without_memory_barrier", "Synchronize without memory barrier");

		interCallGroup->addChild(withBarrierGroup);
		interCallGroup->addChild(withoutBarrierGroup);

		// .with_memory_barrier
		{
			static const struct CaseConfig
			{
				const char*								namePrefix;
				const InterCallTestCase::StorageType	storage;
				const int								flags;
			} configs[] =
			{
				{ "image",			InterCallTestCase::STORAGE_IMAGE,	0																		},
				{ "image_atomic",	InterCallTestCase::STORAGE_IMAGE,	InterCallTestCase::FLAG_USE_ATOMIC | InterCallTestCase::FLAG_USE_INT	},
				{ "ssbo",			InterCallTestCase::STORAGE_BUFFER,	0																		},
				{ "ssbo_atomic",	InterCallTestCase::STORAGE_BUFFER,	InterCallTestCase::FLAG_USE_ATOMIC | InterCallTestCase::FLAG_USE_INT	},
			};

			const int seed0 = 123;
			const int seed1 = 457;

			for (int configNdx = 0; configNdx < DE_LENGTH_OF_ARRAY(configs); ++configNdx)
			{
				const char* const target = (configs[configNdx].storage == InterCallTestCase::STORAGE_BUFFER) ? ("buffer") : ("image");

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_write_read").c_str(),
																 (std::string("Write to ") + target + " and read it").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::Barrier()
																	<< op::ReadData::Generate(1, seed0)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_read_write").c_str(),
																 (std::string("Read from ") + target + " and then write to it").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::ReadZeroData::Generate(1)
																	<< op::Barrier()
																	<< op::WriteData::Generate(1, seed0)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_overwrite").c_str(),
																 (std::string("Write to ") + target + " twice and read it").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::Barrier()
																	<< op::WriteData::Generate(1, seed1)
																	<< op::Barrier()
																	<< op::ReadData::Generate(1, seed1)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_multiple_write_read").c_str(),
																 (std::string("Write to multiple ") + target + "s and read them").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::WriteData::Generate(2, seed1)
																	<< op::Barrier()
																	<< op::ReadMultipleData::Generate(1, seed0, 2, seed1)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_multiple_interleaved_write_read").c_str(),
																 (std::string("Write to same ") + target + " in multiple calls and read it").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteDataInterleaved::Generate(1, seed0, true)
																	<< op::WriteDataInterleaved::Generate(1, seed1, false)
																	<< op::Barrier()
																	<< op::ReadDataInterleaved::Generate(1, seed0, seed1)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_multiple_unrelated_write_read_ordered").c_str(),
																 (std::string("Two unrelated ") + target + " write-reads").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::WriteData::Generate(2, seed1)
																	<< op::Barrier()
																	<< op::ReadData::Generate(1, seed0)
																	<< op::ReadData::Generate(2, seed1)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_multiple_unrelated_write_read_non_ordered").c_str(),
																 (std::string("Two unrelated ") + target + " write-reads").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::WriteData::Generate(2, seed1)
																	<< op::Barrier()
																	<< op::ReadData::Generate(2, seed1)
																	<< op::ReadData::Generate(1, seed0)));
			}

			// .without_memory_barrier
			{
				struct InvocationConfig
				{
					const char*	name;
					int			count;
				};

				static const InvocationConfig ssboInvocations[] =
				{
					{ "1k",		1024	},
					{ "4k",		4096	},
					{ "32k",	32768	},
				};
				static const InvocationConfig imageInvocations[] =
				{
					{ "8x8",		8	},
					{ "32x32",		32	},
					{ "128x128",	128	},
				};
				static const InvocationConfig counterInvocations[] =
				{
					{ "32",		32		},
					{ "128",	128		},
					{ "1k",		1024	},
				};
				static const int callCounts[] = { 2, 5, 100 };

				for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(ssboInvocations); ++invocationNdx)
					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); ++callCountNdx)
						withoutBarrierGroup->addChild(new SSBOConcurrentAtomicCase(m_context, (std::string("ssbo_atomic_dispatch_") + de::toString(callCounts[callCountNdx]) + "_calls_" + ssboInvocations[invocationNdx].name + "_invocations").c_str(),	"", callCounts[callCountNdx], ssboInvocations[invocationNdx].count));

				for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(imageInvocations); ++invocationNdx)
					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); ++callCountNdx)
						withoutBarrierGroup->addChild(new ConcurrentImageAtomicCase(m_context, (std::string("image_atomic_dispatch_") + de::toString(callCounts[callCountNdx]) + "_calls_" + imageInvocations[invocationNdx].name + "_invocations").c_str(),	"", callCounts[callCountNdx], imageInvocations[invocationNdx].count));

				for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(counterInvocations); ++invocationNdx)
					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); ++callCountNdx)
						withoutBarrierGroup->addChild(new ConcurrentAtomicCounterCase(m_context, (std::string("atomic_counter_dispatch_") + de::toString(callCounts[callCountNdx]) + "_calls_" + counterInvocations[invocationNdx].name + "_invocations").c_str(),	"", callCounts[callCountNdx], counterInvocations[invocationNdx].count));

				for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(counterInvocations); ++invocationNdx)
					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); ++callCountNdx)
						withoutBarrierGroup->addChild(new ConcurrentSSBOAtomicCounterMixedCase(m_context, (std::string("ssbo_atomic_counter_mixed_dispatch_") + de::toString(callCounts[callCountNdx]) + "_calls_" + counterInvocations[invocationNdx].name + "_invocations").c_str(),	"", callCounts[callCountNdx], counterInvocations[invocationNdx].count));
			}
		}
	}
}